

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O3

void uS::Socket::ssl_io_cb<uWS::WebSocket<false>>(uv_poll_t *p,int status,int events)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  SSL *s;
  undefined8 *puVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  Socket unaff_retaddr;
  undefined4 local_38;
  undefined4 local_34;
  
  if (status < 0) {
    uWS::WebSocket<false>::onEnd(unaff_retaddr);
    return;
  }
  plVar2 = (long *)p->data;
  lVar3 = *plVar2;
  s = (SSL *)plVar2[1];
  if ((plVar2[4] != 0) && (((events & 2U) != 0 || (iVar6 = SSL_want(s), iVar6 == 3)))) {
    plVar1 = plVar2 + 4;
    local_38 = 1;
    setsockopt((p->io_watcher).fd,6,3,&local_38,4);
    do {
      while( true ) {
        puVar4 = (undefined8 *)plVar2[4];
        iVar6 = SSL_write((SSL *)plVar2[1],(void *)*puVar4,*(int *)(puVar4 + 1));
        if (puVar4[1] != (long)iVar6) break;
        if ((code *)puVar4[3] != (code *)0x0) {
          (*(code *)puVar4[3])(p,puVar4[4],0,puVar4[5]);
        }
        lVar5 = *(long *)(*plVar1 + 0x10);
        operator_delete__((void *)*plVar1);
        if (lVar5 == 0) {
          *plVar1 = 0;
          plVar2[5] = 0;
          if (((*(byte *)(plVar2 + 3) & 2) == 0) || (iVar6 = SSL_want((SSL *)plVar2[1]), iVar6 == 2)
             ) goto LAB_00116670;
          *(undefined4 *)(plVar2 + 3) = 1;
          uVar7 = 1;
          goto LAB_00116664;
        }
        *plVar1 = lVar5;
      }
    } while (0 < iVar6);
    iVar6 = SSL_get_error((SSL *)plVar2[1],iVar6);
    if (iVar6 != 2) {
      if (iVar6 != 3) goto LAB_0011671b;
      if ((*(uint *)(plVar2 + 3) & 2) == 0) {
        uVar7 = *(uint *)(plVar2 + 3) | 2;
        *(uint *)(plVar2 + 3) = uVar7;
LAB_00116664:
        uv_poll_start(p,uVar7,p->poll_cb);
      }
    }
LAB_00116670:
    local_34 = 0;
    setsockopt((p->io_watcher).fd,6,3,&local_34,4);
  }
  if ((events & 1U) != 0) {
    while (iVar6 = SSL_read(s,*(void **)(lVar3 + 8),*(int *)(lVar3 + 0x10)), 0 < iVar6) {
      uWS::WebSocket<false>::onData((Socket)p,*(char **)(lVar3 + 8),iVar6);
      iVar6 = uv_is_closing(p);
      if (iVar6 != 0) {
        return;
      }
      if (*(char *)((long)p->data + 0x1c) != '\0') {
        return;
      }
      iVar6 = SSL_pending(s);
      if (iVar6 == 0) {
        return;
      }
    }
    iVar6 = SSL_get_error(s,iVar6);
    if (iVar6 != 2) {
      if (iVar6 != 3) {
LAB_0011671b:
        uWS::WebSocket<false>::onEnd((Socket)0x116723);
        return;
      }
      if ((*(uint *)(plVar2 + 3) & 2) == 0) {
        uVar7 = *(uint *)(plVar2 + 3) | 2;
        *(uint *)(plVar2 + 3) = uVar7;
        uv_poll_start(p,uVar7,p->poll_cb);
      }
    }
  }
  return;
}

Assistant:

static void ssl_io_cb(uv_poll_t *p, int status, int events) {
        SocketData *socketData = Socket(p).getSocketData();
        NodeData *nodeData = socketData->nodeData;
        SSL *ssl = socketData->ssl;

        if (status < 0) {
            STATE::onEnd(p);
            return;
        }

        if (!socketData->messageQueue.empty() && ((events & UV_WRITABLE) || SSL_want(socketData->ssl) == SSL_READING)) {
            Socket(p).cork(true);
            while (true) {
                SocketData::Queue::Message *messagePtr = socketData->messageQueue.front();
                int sent = SSL_write(socketData->ssl, messagePtr->data, messagePtr->length);
                if (sent == (ssize_t) messagePtr->length) {
                    if (messagePtr->callback) {
                        messagePtr->callback(p, messagePtr->callbackData, false, messagePtr->reserved);
                    }
                    socketData->messageQueue.pop();
                    if (socketData->messageQueue.empty()) {
                        if ((socketData->poll & UV_WRITABLE) && SSL_want(socketData->ssl) != SSL_WRITING) {
                            // todo, remove bit, don't set directly
                            socketData->poll = UV_READABLE;
                            uv_poll_start(p, UV_READABLE, Socket(p).getPollCallback());
                        }
                        break;
                    }
                } else if (sent <= 0) {
                    switch (SSL_get_error(socketData->ssl, sent)) {
                    case SSL_ERROR_WANT_READ:
                        break;
                    case SSL_ERROR_WANT_WRITE:
                        if ((socketData->poll & UV_WRITABLE) == 0) {
                            socketData->poll |= UV_WRITABLE;
                            uv_poll_start(p, socketData->poll, Socket(p).getPollCallback());
                        }
                        break;
                    default:
                        STATE::onEnd(p);
                        return;
                    }
                    break;
                }
            }
            Socket(p).cork(false);
        }

        if (events & UV_READABLE) {
            do {
                int length = SSL_read(ssl, nodeData->recvBuffer, nodeData->recvLength);
                if (length <= 0) {
                    switch (SSL_get_error(ssl, length)) {
                    case SSL_ERROR_WANT_READ:
                        break;
                    case SSL_ERROR_WANT_WRITE:
                        if ((socketData->poll & UV_WRITABLE) == 0) {
                            socketData->poll |= UV_WRITABLE;
                            uv_poll_start(p, socketData->poll, Socket(p).getPollCallback());
                        }
                        break;
                    default:
                        STATE::onEnd(p);
                        return;
                    }
                    break;
                } else {
                    STATE::onData(p, nodeData->recvBuffer, length);
                    if (Socket(p).isClosed() || Socket(p).isShuttingDown()) {
                        return;
                    }
                }
            } while (SSL_pending(ssl));
        }
    }